

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

ExperimentalNs * webrtc::Config::default_value<webrtc::ExperimentalNs>(void)

{
  int iVar1;
  
  if (default_value<webrtc::ExperimentalNs>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::ExperimentalNs>()::def);
    if (iVar1 != 0) {
      default_value<webrtc::ExperimentalNs>::def = (ExperimentalNs *)operator_new(1);
      default_value<webrtc::ExperimentalNs>::def->enabled = false;
      __cxa_guard_release(&default_value<webrtc::ExperimentalNs>()::def);
    }
  }
  return default_value<webrtc::ExperimentalNs>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }